

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O0

float Map_TimeComputeArrivalMax(Map_Man_t *p)

{
  int iVar1;
  float local_24;
  int local_1c;
  int fPhase;
  int i;
  float tReq;
  float tReqMax;
  Map_Man_t *p_local;
  
  i = -0x2333334;
  for (local_1c = 0; local_1c < p->nOutputs; local_1c = local_1c + 1) {
    iVar1 = Map_NodeIsConst(p->pOutputs[local_1c]);
    if (iVar1 == 0) {
      local_24 = *(float *)(((ulong)p->pOutputs[local_1c] & 0xfffffffffffffffe) +
                            (long)(int)(uint)((((ulong)p->pOutputs[local_1c] & 1) != 0 ^ 0xffU) & 1)
                            * 0xc + 0x68);
      if (local_24 < (float)i) {
        local_24 = (float)i;
      }
      i = (int)local_24;
    }
  }
  return (float)i;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes the maximum arrival times.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
float Map_TimeComputeArrivalMax( Map_Man_t * p )
{
    float tReqMax, tReq;
    int i, fPhase;
    // get the critical PO arrival time
    tReqMax = -MAP_FLOAT_LARGE;
    for ( i = 0; i < p->nOutputs; i++ )
    {
        if ( Map_NodeIsConst(p->pOutputs[i]) )
            continue;
        fPhase  = !Map_IsComplement(p->pOutputs[i]);
        tReq    = Map_Regular(p->pOutputs[i])->tArrival[fPhase].Worst;
        tReqMax = MAP_MAX( tReqMax, tReq );
    }
    return tReqMax;
}